

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

int luaY_nvarstack(FuncState *fs)

{
  char cVar1;
  Vardesc *pVVar2;
  int in_EAX;
  uint uVar3;
  long lVar4;
  
  uVar3 = (uint)fs->nactvar;
  do {
    if ((int)uVar3 < 1) {
      return 0;
    }
    pVVar2 = (fs->ls->dyd->actvar).arr;
    lVar4 = (long)(int)(fs->firstlocal + uVar3 + -1);
    cVar1 = *(char *)((long)pVVar2 + lVar4 * 0x18 + 9);
    if (cVar1 != '\x03') {
      in_EAX = (&pVVar2->vd)[lVar4].ridx + 1;
    }
    uVar3 = uVar3 - 1;
  } while (cVar1 == '\x03');
  return in_EAX;
}

Assistant:

int luaY_nvarstack (FuncState *fs) {
  return reglevel(fs, fs->nactvar);
}